

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_set_properties(BEGIN_HANDLE begin,fields properties_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE properties_amqp_value;
  BEGIN_INSTANCE *begin_instance;
  int result;
  fields properties_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xd4b;
  }
  else {
    item_value = amqpvalue_create_fields(properties_value);
    if (item_value == (AMQP_VALUE)0x0) {
      begin_instance._4_4_ = 0xd53;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(begin->composite_value,7,item_value);
      if (iVar1 == 0) {
        begin_instance._4_4_ = 0;
      }
      else {
        begin_instance._4_4_ = 0xd59;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_set_properties(BEGIN_HANDLE begin, fields properties_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        AMQP_VALUE properties_amqp_value = amqpvalue_create_fields(properties_value);
        if (properties_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(begin_instance->composite_value, 7, properties_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(properties_amqp_value);
        }
    }

    return result;
}